

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDP.cpp
# Opt level: O0

string * __thiscall DecPOMDP::SoftPrint_abi_cxx11_(DecPOMDP *this)

{
  ostream *poVar1;
  void *pvVar2;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Discount factor: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 8));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_188,"Reward type: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x10));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string DecPOMDP::SoftPrint() const
{
    stringstream ss;
    ss << "Discount factor: " << _m_discount << endl;
    ss << "Reward type: " << _m_rewardType << endl;
    return ss.str();
}